

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeRecordSet.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::AttributeRecordSet::Decode(AttributeRecordSet *this,KDataStream *stream)

{
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  *this_00;
  KUINT16 KVar1;
  StandardVariable *pSVar2;
  KException *this_01;
  ushort uVar3;
  KUINT32 datumID;
  KString local_50;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (7 < KVar1) {
    this_00 = &this->m_vAttrRec;
    std::
    vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
    ::clear(this_00);
    (*(this->m_EntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_EntityID,stream);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumAttrRecs);
    for (uVar3 = 0; uVar3 < this->m_ui16NumAttrRecs; uVar3 = uVar3 + 1) {
      KVar1 = KDataStream::GetCurrentWritePosition(stream);
      KDataStream::Read<unsigned_int>(stream,&datumID);
      KDataStream::SetCurrentWritePosition(stream,KVar1);
      pSVar2 = FactoryDecoderUser<KDIS::DATA_TYPE::StandardVariable>::FactoryDecode(datumID,stream);
      if (pSVar2 == (StandardVariable *)0x0) {
        pSVar2 = (StandardVariable *)operator_new(0x10);
        StandardVariable::StandardVariable(pSVar2,stream);
        local_50._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00214110;
        local_50._M_string_length = (size_type)pSVar2;
        local_50.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_50.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>>
                    *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)&local_50);
      }
      else {
        local_50._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00214110;
        local_50._M_string_length = (size_type)pSVar2;
        local_50.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_50.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>>
                    *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)&local_50);
      }
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::~KRef_Ptr
                ((KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)&local_50);
    }
    return;
  }
  this_01 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Decode",(allocator<char> *)&datumID);
  KException::KException(this_01,&local_50,2);
  __cxa_throw(this_01,&KException::typeinfo,KException::~KException);
}

Assistant:

void AttributeRecordSet::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < ATTRIBUTE_RECORD_SET_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vAttrRec.clear();

    stream >> KDIS_STREAM m_EntityID
           >> m_ui16NumAttrRecs;

    for( KUINT16 i = 0; i < m_ui16NumAttrRecs; ++i )
    {
        // Save the current write position so we can peek.
        KUINT16 pos = stream.GetCurrentWritePosition();
        KUINT32 datumID;

        // Extract the datum id then reset the stream.
        stream >> datumID;
        stream.SetCurrentWritePosition( pos );

        // Use the factory decoder. 
        StandardVariable * p = StandardVariable::FactoryDecode( datumID, stream );

        // Did we find a custom decoder? if not then use the default.
        if( p )
        {
            m_vAttrRec.push_back( StdVarPtr( p ) );
        }
        else
        {
            // Default
            m_vAttrRec.push_back( StdVarPtr( new StandardVariable( stream ) ) );
        }
    }
}